

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString(String *__return_storage_ptr__,longdouble in)

{
  char *in_00;
  long lVar1;
  size_t sVar2;
  ostringstream oss;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [20];
  longdouble local_1b4;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_1b4 = in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0xf;
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<long_double>(local_1b4);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1d8,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1d0 + -1)) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1d8);
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
  }
  in_00 = local_1d8;
  sVar2 = strlen(local_1d8);
  String::String(__return_storage_ptr__,in_00,(uint)sVar2);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

String toString(double long in) { return fpToString(in, 15); }